

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator==
               (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                *c1,Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                    *c2)

{
  stored_size_type sVar1;
  stored_size_type sVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  bool bVar6;
  bool bVar7;
  
  bVar6 = true;
  if (c1 != c2) {
    sVar1 = (c1->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    sVar2 = (c2->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    if (sVar1 == sVar2) {
      if (sVar2 != 0 && sVar1 != 0) {
        lVar4 = 0;
        do {
          plVar3 = (long *)((long)(c1->column_).
                                  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                                  .super_type.m_holder.m_start + lVar4);
          if ((plVar3 == (long *)0x0) ||
             (plVar5 = (long *)((long)(c2->column_).
                                      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                                      .super_type.m_holder.m_start + lVar4), plVar5 == (long *)0x0))
          {
            __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                          "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, true>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, true>>> **, IsConst = true]"
                         );
          }
          bVar6 = *(int *)(*plVar3 + 0x18) == *(int *)(*plVar5 + 0x18);
        } while (((bVar6) && (sVar1 * 8 + -8 != lVar4)) &&
                (bVar7 = sVar2 * 8 + -8 != lVar4, lVar4 = lVar4 + 8, bVar7));
      }
    }
    else {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool operator==(const Naive_vector_column& c1, const Naive_vector_column& c2) {
    if (&c1 == &c2) return true;
    if (c1.column_.size() != c2.column_.size()) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }